

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O2

size_t bloaty::anon_unknown_0::StringViewToSize(string_view str)

{
  bool bVar1;
  Nonnull<unsigned_long_*> in_RCX;
  Arg *in_R8;
  string_view str_00;
  string_view format;
  size_t ret;
  string local_60;
  absl *local_40;
  char *local_38;
  
  str_00._M_len = str._M_str;
  str_00._M_str = (char *)&ret;
  bVar1 = absl::SimpleAtoi<unsigned_long>((absl *)str._M_len,str_00,in_RCX);
  if (bVar1) {
    return ret;
  }
  format._M_str = (char *)&local_40;
  format._M_len = (size_t)"couldn\'t convert string \'$0\' to integer.";
  local_40 = (absl *)str._M_len;
  local_38 = str_00._M_len;
  absl::Substitute_abi_cxx11_(&local_60,(absl *)0x28,format,in_R8);
  Throw(local_60._M_dataplus._M_p,0x34);
}

Assistant:

size_t StringViewToSize(string_view str) {
  size_t ret;
  if (!absl::SimpleAtoi(str, &ret)) {
    THROWF("couldn't convert string '$0' to integer.", str);
  }
  return ret;
}